

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  ImVec2 p_max_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id_00;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiDataTypeInfo *pIVar5;
  long in_RCX;
  char *in_RDX;
  ImGuiDataType in_ESI;
  void *in_RDI;
  long in_R8;
  char *in_R9;
  float _x;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 p_v;
  uint in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImU32 frame_col;
  bool is_clamp_input;
  bool make_active;
  bool double_clicked;
  bool clicked;
  bool input_requested_by_tabbing;
  bool temp_input_is_active;
  bool hovered;
  bool temp_input_allowed;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe08;
  float text_baseline_y;
  ImRect *in_stack_fffffffffffffe10;
  ImGuiInputFlags in_stack_fffffffffffffe18;
  ImGuiID in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  ImGuiWindow *in_stack_fffffffffffffe28;
  ImGuiWindow *in_stack_fffffffffffffe30;
  ImGuiWindow *in_stack_fffffffffffffe38;
  ImVec2 *align;
  undefined8 in_stack_fffffffffffffe40;
  ImGuiID id_01;
  ImVec2 *text_size_if_known;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar8;
  char *in_stack_fffffffffffffe50;
  ImVec2 *in_stack_fffffffffffffe58;
  ImVec2 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  ImRect *in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  ImVec2 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe91;
  undefined1 in_stack_fffffffffffffe93;
  undefined1 in_stack_fffffffffffffe94;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffea0;
  void *pvVar10;
  ImRect *bb;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 *local_120;
  ImVec2 local_118 [9];
  byte local_c9;
  ImU32 local_b4;
  undefined1 local_b0;
  byte local_af;
  byte local_ae;
  byte local_ad;
  byte local_ac;
  byte local_ab;
  byte local_aa;
  byte local_a9;
  ImVec2 local_a8;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float local_68;
  float fStack_64;
  char *local_40;
  bool local_1;
  
  id_01 = (ImGuiID)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    pvVar10 = (void *)0x0;
    id_00 = ImGuiWindow::GetID(in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,
                               in_stack_fffffffffffffe20);
    _x = CalcItemWidth();
    IVar7 = CalcTextSize((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
                         SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0),
                         SUB84(in_stack_fffffffffffffe28,0));
    fStack_64 = IVar7.y;
    fVar6 = (pIVar1->Style).FramePadding.y;
    bb = (ImRect *)&stack0xffffffffffffff78;
    ImVec2::ImVec2((ImVec2 *)bb,_x,fVar6 + fVar6 + fStack_64);
    p_v = ::operator+(in_stack_fffffffffffffe08,(ImVec2 *)0x4f5771);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff88,&(pIVar4->DC).CursorPos,
                   (ImVec2 *)&stack0xffffffffffffff80);
    local_68 = IVar7.x;
    if (local_68 <= 0.0) {
      fVar6 = 0.0;
    }
    else {
      fVar6 = (pIVar1->Style).ItemInnerSpacing.x + local_68;
    }
    ImVec2::ImVec2(&local_a8,fVar6,0.0);
    IVar7 = ::operator+(in_stack_fffffffffffffe08,(ImVec2 *)0x4f5831);
    text_baseline_y = (float)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff68,(ImVec2 *)&stack0xffffffffffffff88,
                   (ImVec2 *)&stack0xffffffffffffff60);
    local_a9 = (in_stack_00000008 & 0x80) == 0;
    ItemSize(in_stack_fffffffffffffe10,text_baseline_y);
    bVar2 = ItemAdd((ImRect *)in_stack_fffffffffffffe38,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe28,
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffe20 >> 0x20));
    if (bVar2) {
      local_40 = in_R9;
      if (in_R9 == (char *)0x0) {
        pIVar5 = DataTypeGetInfo(in_ESI);
        local_40 = pIVar5->PrintFmt;
      }
      local_aa = ItemHoverable((ImRect *)in_stack_fffffffffffffe28,
                               (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      uVar9 = false;
      if ((local_a9 & 1) != 0) {
        uVar9 = TempInputIsActive(id_00);
      }
      local_ab = uVar9;
      if ((bool)uVar9 == false) {
        in_stack_fffffffffffffe96 = false;
        if ((local_a9 & 1) != 0) {
          in_stack_fffffffffffffe96 = ((pIVar1->LastItemData).StatusFlags & 0x100U) != 0;
        }
        in_stack_fffffffffffffe95 = false;
        local_ac = in_stack_fffffffffffffe96;
        if ((local_aa & 1) != 0) {
          in_stack_fffffffffffffe95 =
               IsMouseClicked((ImGuiMouseButton)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                              in_stack_fffffffffffffe18);
        }
        in_stack_fffffffffffffe94 = false;
        local_ad = in_stack_fffffffffffffe95;
        if (((local_aa & 1) != 0) &&
           (in_stack_fffffffffffffe94 = false, (pIVar1->IO).MouseClickedCount[0] == 2)) {
          in_stack_fffffffffffffe94 =
               TestKeyOwner((ImGuiKey)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        }
        in_stack_fffffffffffffe93 = true;
        if (((((local_ac & 1) == 0) && (in_stack_fffffffffffffe93 = true, (local_ad & 1) == 0)) &&
            (in_stack_fffffffffffffe93 = true, (bool)in_stack_fffffffffffffe94 == false)) &&
           (in_stack_fffffffffffffe93 = true, pIVar1->NavActivateId != id_00)) {
          in_stack_fffffffffffffe93 = pIVar1->NavActivateInputId == id_00;
        }
        local_af = in_stack_fffffffffffffe93;
        local_ae = in_stack_fffffffffffffe94;
        if (((bool)in_stack_fffffffffffffe93 != false) &&
           (((local_ad & 1) != 0 || ((bool)in_stack_fffffffffffffe94 != false)))) {
          SetKeyOwner((ImGuiKey)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                      (ImGuiID)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        }
        if ((((local_af & 1) != 0) && ((local_a9 & 1) != 0)) &&
           ((((local_ac & 1) != 0 ||
             ((((local_ad & 1) != 0 && (((pIVar1->IO).KeyCtrl & 1U) != 0)) || ((local_ae & 1) != 0))
             )) || (pIVar1->NavActivateInputId == id_00)))) {
          local_ab = 1;
        }
        if ((((((pIVar1->IO).ConfigDragClickToInputText & 1U) != 0) && ((local_a9 & 1) != 0)) &&
            (((local_ab & 1) == 0 && ((pIVar1->ActiveId == id_00 && ((local_aa & 1) != 0)))))) &&
           ((((pIVar1->IO).MouseReleased[0] & 1U) != 0 &&
            (bVar2 = IsMouseDragPastThreshold(0,(pIVar1->IO).MouseDragThreshold * 0.5), !bVar2)))) {
          pIVar1->NavActivateInputId = id_00;
          pIVar1->NavActivateId = id_00;
          pIVar1->NavActivateFlags = 1;
          local_ab = 1;
        }
        if (((local_af & 1) != 0) && ((local_ab & 1) == 0)) {
          SetActiveID(id_01,in_stack_fffffffffffffe38);
          SetFocusID((ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe28);
          FocusWindow(in_stack_fffffffffffffe30);
          pIVar1->ActiveIdUsingNavDirMask = 3;
        }
      }
      if ((local_ab & 1) == 0) {
        if (pIVar1->ActiveId == id_00) {
          uVar8 = 9;
        }
        else {
          uVar8 = 7;
          if ((local_aa & 1) != 0) {
            uVar8 = 8;
          }
        }
        local_b4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                               SUB84(in_stack_fffffffffffffe20,0));
        RenderNavHighlight(bb,(ImGuiID)((ulong)pvVar10 >> 0x20),(ImGuiNavHighlightFlags)pvVar10);
        p_max_00.y = in_stack_fffffffffffffe7c;
        p_max_00.x = in_stack_fffffffffffffe78;
        RenderFrame(in_stack_fffffffffffffe80,p_max_00,
                    (ImU32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffe70 >> 0x18,0),in_stack_fffffffffffffe6c);
        pvVar10 = (void *)CONCAT44(text_baseline_y,in_stack_00000008);
        local_c9 = DragBehavior((ImGuiID)in_stack_ffffffffffffff90,
                                (ImGuiDataType)in_stack_ffffffffffffff8c,(void *)p_v,
                                in_stack_ffffffffffffff7c,(void *)in_stack_ffffffffffffff70,
                                (void *)in_stack_ffffffffffffff68,(char *)IVar7,(ImGuiSliderFlags)_x
                               );
        if ((bool)local_c9) {
          MarkItemEdited(id_00);
        }
        text_size_if_known = local_118;
        iVar3 = DataTypeFormatString
                          ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                           (ImGuiDataType)in_stack_fffffffffffffe10,pvVar10,(char *)0x4f5f23);
        local_120 = (ImVec2 *)((long)&text_size_if_known->x + (long)iVar3);
        if ((pIVar1->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        align = local_120;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          in_stack_fffffffffffffe50,
                          (char *)CONCAT44(uVar8,in_stack_fffffffffffffe48),text_size_if_known,align
                          ,in_stack_fffffffffffffe70);
        uVar9 = (undefined1)((uint)uVar8 >> 0x18);
        if (0.0 < local_68) {
          ImVec2::ImVec2(&local_130,in_stack_ffffffffffffff90 + (pIVar1->Style).ItemInnerSpacing.x,
                         in_stack_ffffffffffffff8c + (pIVar1->Style).FramePadding.y);
          RenderText(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe50,(bool)uVar9);
        }
        local_1 = (bool)(local_c9 & 1);
      }
      else {
        local_b0 = false;
        if ((((in_stack_00000008 & 0x10) != 0) &&
            (in_stack_fffffffffffffe91 = true, local_b0 = in_stack_fffffffffffffe91, in_RCX != 0))
           && (in_stack_fffffffffffffe91 = true, local_b0 = in_stack_fffffffffffffe91, in_R8 != 0))
        {
          iVar3 = DataTypeCompare((ImGuiDataType)SUB84(in_stack_fffffffffffffe20,0),
                                  (void *)CONCAT44(in_stack_fffffffffffffe1c,
                                                   in_stack_fffffffffffffe18),
                                  in_stack_fffffffffffffe10);
          in_stack_fffffffffffffe91 = iVar3 < 0;
          local_b0 = in_stack_fffffffffffffe91;
        }
        local_1 = TempInputScalar((ImRect *)
                                  CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffe96,
                                                          CONCAT15(in_stack_fffffffffffffe95,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe94,
                                                  CONCAT13(in_stack_fffffffffffffe93,
                                                           CONCAT12(local_b0,CONCAT11(
                                                  in_stack_fffffffffffffe91,
                                                  in_stack_fffffffffffffe90))))))),
                                  (ImGuiID)((ulong)local_40 >> 0x20),in_RDX,in_ESI,in_RDI,
                                  (char *)CONCAT44(id_00,in_stack_fffffffffffffe68),
                                  (void *)CONCAT44(fVar6,in_stack_fffffffffffffea0),pvVar10);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb, temp_input_allowed ? ImGuiItemFlags_Inputable : 0))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        // Tabbing or CTRL-clicking on Drag turns it into an InputText
        const bool input_requested_by_tabbing = temp_input_allowed && (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_FocusedByTabbing) != 0;
        const bool clicked = hovered && IsMouseClicked(0, id);
        const bool double_clicked = (hovered && g.IO.MouseClickedCount[0] == 2 && TestKeyOwner(ImGuiKey_MouseLeft, id));
        const bool make_active = (input_requested_by_tabbing || clicked || double_clicked || g.NavActivateId == id || g.NavActivateInputId == id);
        if (make_active && (clicked || double_clicked))
            SetKeyOwner(ImGuiKey_MouseLeft, id);
        if (make_active && temp_input_allowed)
            if (input_requested_by_tabbing || (clicked && g.IO.KeyCtrl) || double_clicked || g.NavActivateInputId == id)
                temp_input_is_active = true;

        // (Optional) simple click (without moving) turns Drag into an InputText
        if (g.IO.ConfigDragClickToInputText && temp_input_allowed && !temp_input_is_active)
            if (g.ActiveId == id && hovered && g.IO.MouseReleased[0] && !IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
            {
                g.NavActivateId = g.NavActivateInputId = id;
                g.NavActivateFlags = ImGuiActivateFlags_PreferInput;
                temp_input_is_active = true;
            }

        if (make_active && !temp_input_is_active)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
        }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0 && (p_min == NULL || p_max == NULL || DataTypeCompare(data_type, p_min, p_max) < 0);
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Drag behavior
    const bool value_changed = DragBehavior(id, data_type, p_data, v_speed, p_min, p_max, format, flags);
    if (value_changed)
        MarkItemEdited(id);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    if (g.LogEnabled)
        LogSetNextTextDecoration("{", "}");
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return value_changed;
}